

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall JSONTest_Stringify_Test::TestBody(JSONTest_Stringify_Test *this)

{
  char *curr;
  undefined *__ptr;
  char *message;
  stringstream local_1f0 [8];
  stringstream ss;
  undefined1 local_1e0 [112];
  ios_base local_170 [264];
  undefined1 local_68 [8];
  Value value;
  char *input;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  internal local_28 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  AssertHelper local_18;
  
  value.field_1.str.str._M_str = "[\"hello\",\"world\"]";
  curr = strdup("[\"hello\",\"world\"]");
  local_68._0_4_ = Null;
  value.type = String;
  value._4_4_ = 0;
  json::Value::parse((Value *)local_68,curr,ASCII);
  std::__cxx11::stringstream::stringstream(local_1f0);
  json::Value::stringify((ostream *)local_68,SUB81(local_1e0,0));
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<std::__cxx11::string,char_const*>
            (local_28,"ss.str()","input",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&input,
             (char **)((long)&value.field_1 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)input != &local_38) {
    operator_delete(input,local_38._M_allocated_capacity + 1);
  }
  if (local_28[0] == (internal)0x0) {
    testing::Message::Message((Message *)&input);
    if (local_20 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_20->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/json.cpp"
               ,0xe,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&input);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (input != (char *)0x0) {
      (**(code **)(*(long *)input + 8))();
    }
  }
  if (local_20 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_20,local_20);
  }
  free(curr);
  __ptr = &std::__cxx11::stringstream::VTT;
  std::__cxx11::stringstream::~stringstream(local_1f0);
  std::ios_base::~ios_base(local_170);
  json::Value::free((Value *)local_68,__ptr);
  return;
}

Assistant:

TEST_F(JSONTest, Stringify) {
  // TODO: change the API to not require a copy
  auto input = "[\"hello\",\"world\"]";
  auto* copy = strdup(input);
  json::Value value;
  value.parse(copy, json::Value::ASCII);
  std::stringstream ss;
  value.stringify(ss);
  EXPECT_EQ(ss.str(), input);
  free(copy);
}